

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSlab::~IfcSlab(IfcSlab *this)

{
  *(undefined8 *)&this[-1].field_0x50 = 0x9bbea8;
  *(undefined8 *)&this->field_0x38 = 0x9bbfc0;
  *(undefined8 *)&this[-1].field_0xd8 = 0x9bbed0;
  *(undefined8 *)&this[-1].field_0xe8 = 0x9bbef8;
  *(undefined8 *)&this[-1].field_0x120 = 0x9bbf20;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x9bbf48;
  *(undefined8 *)&this[-1].field_0x188 = 0x9bbf70;
  *(undefined8 *)this = 0x9bbf98;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x50,&PTR_construction_vtable_24__009bbfe0);
  operator_delete(&this[-1].field_0x50);
  return;
}

Assistant:

IfcSlab() : Object("IfcSlab") {}